

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaD_rawrunprotected(lua_State *L,Pfunc f,void *ud)

{
  int iVar1;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  lua_longjmp lj;
  undefined8 local_f0;
  __jmp_buf_tag _Stack_e8;
  int local_20;
  undefined8 local_18;
  code *local_10;
  long local_8;
  
  local_20 = 0;
  local_f0 = *(undefined8 *)(in_RDI + 0xa8);
  *(undefined8 **)(in_RDI + 0xa8) = &local_f0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = _setjmp(&_Stack_e8);
  if (iVar1 == 0) {
    (*local_10)(local_8,local_18);
  }
  *(undefined8 *)(local_8 + 0xa8) = local_f0;
  return local_20;
}

Assistant:

static int luaD_rawrunprotected(lua_State*L,Pfunc f,void*ud){
struct lua_longjmp lj;
lj.status=0;
lj.previous=L->errorJmp;
L->errorJmp=&lj;
LUAI_TRY(L,&lj,
(*f)(L,ud);
);
L->errorJmp=lj.previous;
return lj.status;
}